

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O0

bool __thiscall
tinyusdz::usdc::USDCReader::Impl::ReconstrcutStageMeta
          (Impl *this,FieldValuePairVector *fvs,StageMetas *metas)

{
  double dVar1;
  bool bVar2;
  value_type *__x;
  value_type *__x_00;
  value_type_conflict5 *pvVar3;
  value_type_conflict1 *pvVar4;
  value_type *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  value_type *pvVar6;
  value_type *pvVar7;
  value_type *__x_01;
  string *psVar8;
  size_type sVar9;
  double dVar10;
  string *psVar11;
  size_type sVar12;
  reference pvVar13;
  reference pvVar14;
  ostream *poVar15;
  string local_2ec8;
  ostringstream local_2ea8 [8];
  ostringstream ss_w_1;
  ulong local_2d30;
  size_t i_1;
  undefined1 local_2ce8 [8];
  SubLayer s;
  size_t i;
  vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_> dst;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c58;
  ostringstream local_2c38 [8];
  ostringstream ss_w;
  undefined1 local_2ac0 [8];
  StringData sdata_1;
  string local_2a70;
  string local_2a50 [32];
  ostringstream local_2a30 [8];
  ostringstream ss_e_19;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28b8;
  undefined1 local_2890 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> v_5;
  StringData sdata;
  string local_2818;
  string local_27f8 [32];
  ostringstream local_27d8 [8];
  ostringstream ss_e_18;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2660;
  undefined1 local_2638 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> v_4;
  string local_25f0;
  string local_25d0 [32];
  ostringstream local_25b0 [8];
  ostringstream ss_e_17;
  optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> local_2438;
  undefined1 local_2418 [8];
  optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> v_3;
  string local_23d8;
  string local_23b8 [32];
  ostringstream local_2398 [8];
  ostringstream ss_e_16;
  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_2220;
  undefined1 local_21e8 [8];
  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  v_2;
  ostringstream local_2190 [8];
  ostringstream ss_e_15;
  optional<tinyusdz::Token> local_2018;
  undefined1 local_1ff0 [8];
  optional<tinyusdz::Token> v_1;
  string local_1fa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f68;
  ostringstream local_1f48 [8];
  ostringstream ss_e_14;
  string local_1dd0;
  ostringstream local_1db0 [8];
  ostringstream ss_e_13;
  PlaybackMode local_1c38;
  PlaybackMode local_1c34;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c30;
  undefined1 local_1c08 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> vs_3;
  ostringstream local_1bc0 [8];
  ostringstream ss_e_12;
  PlaybackMode local_1a48;
  PlaybackMode local_1a44;
  optional<tinyusdz::Token> local_1a40;
  undefined1 local_1a18 [8];
  optional<tinyusdz::Token> vf_7;
  string local_19d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_19b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1990;
  ostringstream local_1970 [8];
  ostringstream ss_e_11;
  string local_17f8;
  ostringstream local_17d8 [8];
  ostringstream ss_e_10;
  bool local_1659;
  undefined1 local_1658 [7];
  bool autoPlay;
  undefined1 local_1630 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> vs_2;
  undefined1 local_1600 [6];
  optional<bool> vf_6;
  string local_15e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15a0;
  ostringstream local_1580 [8];
  ostringstream ss_e_9;
  optional<double> local_1408;
  undefined1 local_13f8 [8];
  optional<double> vd_5;
  optional<float> local_13e0;
  optional<float> local_13d8;
  optional<float> vf_5;
  string local_13b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1370;
  ostringstream local_1350 [8];
  ostringstream ss_e_8;
  optional<double> local_11d8;
  undefined1 local_11c8 [8];
  optional<double> vd_4;
  optional<float> local_11b0;
  optional<float> local_11a8;
  optional<float> vf_4;
  string local_1180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1140;
  ostringstream local_1120 [8];
  ostringstream ss_e_7;
  optional<std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>_> local_fa8;
  undefined1 local_f88 [8];
  optional<std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>_> vs_1;
  string local_f48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f08;
  ostringstream local_ee8 [8];
  ostringstream ss_e_6;
  optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d70;
  undefined1 local_d50 [8];
  optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vs;
  string local_d10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd0;
  ostringstream local_cb0 [8];
  ostringstream ss_e_5;
  optional<double> local_b38;
  undefined1 local_b28 [8];
  optional<double> vd_3;
  optional<float> local_b10;
  optional<float> local_b08;
  optional<float> vf_3;
  string local_ae0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa0;
  ostringstream local_a80 [8];
  ostringstream ss_e_4;
  optional<double> local_908;
  undefined1 local_8f8 [8];
  optional<double> vd_2;
  optional<float> local_8e0;
  optional<float> local_8d8;
  optional<float> vf_2;
  string local_8b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_890;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_870;
  ostringstream local_850 [8];
  ostringstream ss_e_3;
  optional<double> local_6d8;
  undefined1 local_6c8 [8];
  optional<double> vd_1;
  optional<float> local_6b0;
  optional<float> local_6a8;
  optional<float> vf_1;
  string local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  ostringstream local_620 [8];
  ostringstream ss_e_2;
  optional<double> local_4a8;
  undefined1 local_498 [8];
  optional<double> vd;
  optional<float> local_480;
  optional<float> local_478;
  optional<float> vf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  ostringstream local_410 [8];
  ostringstream ss_e_1;
  Axis local_294;
  Axis local_290;
  Axis local_28c;
  undefined1 local_288 [8];
  string v;
  string local_260;
  ostringstream local_240 [8];
  ostringstream ss_e;
  optional<tinyusdz::Token> local_c8;
  undefined1 local_a0 [8];
  optional<tinyusdz::Token> vt;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>
  *fv;
  const_iterator __end2;
  const_iterator __begin2;
  FieldValuePairVector *__range2;
  vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_> subLayerOffsets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subLayers;
  StageMetas *metas_local;
  FieldValuePairVector *fvs_local;
  Impl *this_local;
  
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&subLayerOffsets.
               super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>::vector
            ((vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_> *)&__range2);
  __end2 = ::std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
           ::begin(fvs);
  fv = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>
        *)::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
          ::end(fvs);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>
                                     *)&fv), bVar2) {
    vt.contained._24_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>
         ::operator*(&__end2);
    bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              vt.contained._24_8_,"upAxis");
    if (bVar2) {
      crate::CrateValue::get_value<tinyusdz::Token>
                (&local_c8,(CrateValue *)(vt.contained._24_8_ + 0x20));
      nonstd::optional_lite::optional<tinyusdz::Token>::optional<tinyusdz::Token,_0>
                ((optional<tinyusdz::Token> *)local_a0,&local_c8);
      nonstd::optional_lite::optional<tinyusdz::Token>::~optional(&local_c8);
      bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_a0);
      if (bVar2) {
        pvVar6 = nonstd::optional_lite::optional<tinyusdz::Token>::value
                           ((optional<tinyusdz::Token> *)local_a0);
        psVar11 = Token::str_abi_cxx11_(pvVar6);
        ::std::__cxx11::string::string((string *)local_288,(string *)psVar11);
        bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_288,"Y");
        if (bVar2) {
          local_28c = Y;
          TypedAttributeWithFallback<tinyusdz::Axis>::operator=(&metas->upAxis,&local_28c);
LAB_001cd289:
          v.field_2._12_4_ = 0;
        }
        else {
          bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_288,"Z");
          if (bVar2) {
            local_290 = Z;
            TypedAttributeWithFallback<tinyusdz::Axis>::operator=(&metas->upAxis,&local_290);
            goto LAB_001cd289;
          }
          bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_288,"X");
          if (bVar2) {
            local_294 = X;
            TypedAttributeWithFallback<tinyusdz::Axis>::operator=(&metas->upAxis,&local_294);
            goto LAB_001cd289;
          }
          ::std::__cxx11::ostringstream::ostringstream(local_410);
          poVar15 = ::std::operator<<((ostream *)local_410,"[error]");
          poVar15 = ::std::operator<<(poVar15,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                     );
          poVar15 = ::std::operator<<(poVar15,":");
          poVar15 = ::std::operator<<(poVar15,"ReconstrcutStageMeta");
          poVar15 = ::std::operator<<(poVar15,"():");
          poVar15 = (ostream *)::std::ostream::operator<<(poVar15,0x60f);
          ::std::operator<<(poVar15," ");
          ::std::operator+(&local_450,"`upAxis` must be \'X\', \'Y\' or \'Z\' but got \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_288);
          ::std::operator+(&local_430,&local_450,"\'(note: Case sensitive)");
          poVar15 = ::std::operator<<((ostream *)local_410,(string *)&local_430);
          ::std::operator<<(poVar15,"\n");
          ::std::__cxx11::string::~string((string *)&local_430);
          ::std::__cxx11::string::~string((string *)&local_450);
          ::std::__cxx11::ostringstream::str();
          PushError(this,(string *)&vf);
          ::std::__cxx11::string::~string((string *)&vf);
          this_local._7_1_ = 0;
          v.field_2._12_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_410);
        }
        ::std::__cxx11::string::~string((string *)local_288);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_240);
        poVar15 = ::std::operator<<((ostream *)local_240,"[error]");
        poVar15 = ::std::operator<<(poVar15,
                                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                   );
        poVar15 = ::std::operator<<(poVar15,":");
        poVar15 = ::std::operator<<(poVar15,"ReconstrcutStageMeta");
        poVar15 = ::std::operator<<(poVar15,"():");
        poVar15 = (ostream *)::std::ostream::operator<<(poVar15,0x603);
        ::std::operator<<(poVar15," ");
        poVar15 = ::std::operator<<((ostream *)local_240,"`upAxis` must be `token` type.");
        ::std::operator<<(poVar15,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_260);
        ::std::__cxx11::string::~string((string *)&local_260);
        this_local._7_1_ = 0;
        v.field_2._12_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_240);
      }
      nonstd::optional_lite::optional<tinyusdz::Token>::~optional
                ((optional<tinyusdz::Token> *)local_a0);
      goto joined_r0x001cdf3a;
    }
    bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              vt.contained._24_8_,"metersPerUnit");
    if (bVar2) {
      crate::CrateValue::get_value<float>(&local_480,(CrateValue *)(vt.contained._24_8_ + 0x20));
      nonstd::optional_lite::optional<float>::optional<float,_0>(&local_478,&local_480);
      nonstd::optional_lite::optional<float>::~optional(&local_480);
      bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_478);
      if (bVar2) {
        pvVar3 = nonstd::optional_lite::optional<float>::value(&local_478);
        vd.contained = (storage_t<double>)(double)*pvVar3;
        TypedAttributeWithFallback<double>::operator=(&metas->metersPerUnit,(double *)&vd.contained)
        ;
LAB_001cd538:
        v.field_2._12_4_ = 0;
      }
      else {
        crate::CrateValue::get_value<double>(&local_4a8,(CrateValue *)(vt.contained._24_8_ + 0x20));
        nonstd::optional_lite::optional<double>::optional<double,_0>
                  ((optional<double> *)local_498,&local_4a8);
        nonstd::optional_lite::optional<double>::~optional(&local_4a8);
        bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_498);
        if (bVar2) {
          pvVar4 = nonstd::optional_lite::optional<double>::value((optional<double> *)local_498);
          TypedAttributeWithFallback<double>::operator=(&metas->metersPerUnit,pvVar4);
          v.field_2._12_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_620);
          poVar15 = ::std::operator<<((ostream *)local_620,"[error]");
          poVar15 = ::std::operator<<(poVar15,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                     );
          poVar15 = ::std::operator<<(poVar15,":");
          poVar15 = ::std::operator<<(poVar15,"ReconstrcutStageMeta");
          poVar15 = ::std::operator<<(poVar15,"():");
          poVar15 = (ostream *)::std::ostream::operator<<(poVar15,0x61b);
          ::std::operator<<(poVar15," ");
          crate::CrateValue::type_name_abi_cxx11_
                    (&local_680,(CrateValue *)(vt.contained._24_8_ + 0x20));
          ::std::operator+((char *)&local_660,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "`metersPerUnit` value must be double or float type, but got \'");
          ::std::operator+(&local_640,&local_660,"\'");
          poVar15 = ::std::operator<<((ostream *)local_620,(string *)&local_640);
          ::std::operator<<(poVar15,"\n");
          ::std::__cxx11::string::~string((string *)&local_640);
          ::std::__cxx11::string::~string((string *)&local_660);
          ::std::__cxx11::string::~string((string *)&local_680);
          ::std::__cxx11::ostringstream::str();
          PushError(this,(string *)&vf_1);
          ::std::__cxx11::string::~string((string *)&vf_1);
          this_local._7_1_ = 0;
          v.field_2._12_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_620);
        }
        nonstd::optional_lite::optional<double>::~optional((optional<double> *)local_498);
        if (v.field_2._12_4_ == 0) goto LAB_001cd538;
      }
      nonstd::optional_lite::optional<float>::~optional(&local_478);
joined_r0x001cdf3a:
      if (v.field_2._12_4_ != 0) goto LAB_001cfd59;
    }
    else {
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )vt.contained._24_8_,"kilogramsPerUnit");
      if (bVar2) {
        crate::CrateValue::get_value<float>(&local_6b0,(CrateValue *)(vt.contained._24_8_ + 0x20));
        nonstd::optional_lite::optional<float>::optional<float,_0>(&local_6a8,&local_6b0);
        nonstd::optional_lite::optional<float>::~optional(&local_6b0);
        bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_6a8);
        if (bVar2) {
          pvVar3 = nonstd::optional_lite::optional<float>::value(&local_6a8);
          vd_1.contained = (storage_t<double>)(double)*pvVar3;
          TypedAttributeWithFallback<double>::operator=
                    (&metas->kilogramsPerUnit,(double *)&vd_1.contained);
LAB_001cd7db:
          v.field_2._12_4_ = 0;
        }
        else {
          crate::CrateValue::get_value<double>
                    (&local_6d8,(CrateValue *)(vt.contained._24_8_ + 0x20));
          nonstd::optional_lite::optional<double>::optional<double,_0>
                    ((optional<double> *)local_6c8,&local_6d8);
          nonstd::optional_lite::optional<double>::~optional(&local_6d8);
          bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_6c8);
          if (bVar2) {
            pvVar4 = nonstd::optional_lite::optional<double>::value((optional<double> *)local_6c8);
            TypedAttributeWithFallback<double>::operator=(&metas->kilogramsPerUnit,pvVar4);
            v.field_2._12_4_ = 0;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_850);
            poVar15 = ::std::operator<<((ostream *)local_850,"[error]");
            poVar15 = ::std::operator<<(poVar15,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                       );
            poVar15 = ::std::operator<<(poVar15,":");
            poVar15 = ::std::operator<<(poVar15,"ReconstrcutStageMeta");
            poVar15 = ::std::operator<<(poVar15,"():");
            poVar15 = (ostream *)::std::ostream::operator<<(poVar15,0x626);
            ::std::operator<<(poVar15," ");
            crate::CrateValue::type_name_abi_cxx11_
                      (&local_8b0,(CrateValue *)(vt.contained._24_8_ + 0x20));
            ::std::operator+((char *)&local_890,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "`kilogramsPerUnit` value must be double or float type, but got \'");
            ::std::operator+(&local_870,&local_890,"\'");
            poVar15 = ::std::operator<<((ostream *)local_850,(string *)&local_870);
            ::std::operator<<(poVar15,"\n");
            ::std::__cxx11::string::~string((string *)&local_870);
            ::std::__cxx11::string::~string((string *)&local_890);
            ::std::__cxx11::string::~string((string *)&local_8b0);
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)&vf_2);
            ::std::__cxx11::string::~string((string *)&vf_2);
            this_local._7_1_ = 0;
            v.field_2._12_4_ = 1;
            ::std::__cxx11::ostringstream::~ostringstream(local_850);
          }
          nonstd::optional_lite::optional<double>::~optional((optional<double> *)local_6c8);
          if (v.field_2._12_4_ == 0) goto LAB_001cd7db;
        }
        nonstd::optional_lite::optional<float>::~optional(&local_6a8);
        goto joined_r0x001cdf3a;
      }
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )vt.contained._24_8_,"timeCodesPerSecond");
      if (bVar2) {
        crate::CrateValue::get_value<float>(&local_8e0,(CrateValue *)(vt.contained._24_8_ + 0x20));
        nonstd::optional_lite::optional<float>::optional<float,_0>(&local_8d8,&local_8e0);
        nonstd::optional_lite::optional<float>::~optional(&local_8e0);
        bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_8d8);
        if (bVar2) {
          pvVar3 = nonstd::optional_lite::optional<float>::value(&local_8d8);
          vd_2.contained = (storage_t<double>)(double)*pvVar3;
          TypedAttributeWithFallback<double>::operator=
                    (&metas->timeCodesPerSecond,(double *)&vd_2.contained);
LAB_001cda7e:
          v.field_2._12_4_ = 0;
        }
        else {
          crate::CrateValue::get_value<double>
                    (&local_908,(CrateValue *)(vt.contained._24_8_ + 0x20));
          nonstd::optional_lite::optional<double>::optional<double,_0>
                    ((optional<double> *)local_8f8,&local_908);
          nonstd::optional_lite::optional<double>::~optional(&local_908);
          bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_8f8);
          if (bVar2) {
            pvVar4 = nonstd::optional_lite::optional<double>::value((optional<double> *)local_8f8);
            TypedAttributeWithFallback<double>::operator=(&metas->timeCodesPerSecond,pvVar4);
            v.field_2._12_4_ = 0;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_a80);
            poVar15 = ::std::operator<<((ostream *)local_a80,"[error]");
            poVar15 = ::std::operator<<(poVar15,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                       );
            poVar15 = ::std::operator<<(poVar15,":");
            poVar15 = ::std::operator<<(poVar15,"ReconstrcutStageMeta");
            poVar15 = ::std::operator<<(poVar15,"():");
            poVar15 = (ostream *)::std::ostream::operator<<(poVar15,0x632);
            ::std::operator<<(poVar15," ");
            crate::CrateValue::type_name_abi_cxx11_
                      (&local_ae0,(CrateValue *)(vt.contained._24_8_ + 0x20));
            ::std::operator+((char *)&local_ac0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "`timeCodesPerSecond` value must be double or float type, but got \'");
            ::std::operator+(&local_aa0,&local_ac0,"\'");
            poVar15 = ::std::operator<<((ostream *)local_a80,(string *)&local_aa0);
            ::std::operator<<(poVar15,"\n");
            ::std::__cxx11::string::~string((string *)&local_aa0);
            ::std::__cxx11::string::~string((string *)&local_ac0);
            ::std::__cxx11::string::~string((string *)&local_ae0);
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)&vf_3);
            ::std::__cxx11::string::~string((string *)&vf_3);
            this_local._7_1_ = 0;
            v.field_2._12_4_ = 1;
            ::std::__cxx11::ostringstream::~ostringstream(local_a80);
          }
          nonstd::optional_lite::optional<double>::~optional((optional<double> *)local_8f8);
          if (v.field_2._12_4_ == 0) goto LAB_001cda7e;
        }
        nonstd::optional_lite::optional<float>::~optional(&local_8d8);
        goto joined_r0x001cdf3a;
      }
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )vt.contained._24_8_,"startTimeCode");
      if (bVar2) {
        crate::CrateValue::get_value<float>(&local_b10,(CrateValue *)(vt.contained._24_8_ + 0x20));
        nonstd::optional_lite::optional<float>::optional<float,_0>(&local_b08,&local_b10);
        nonstd::optional_lite::optional<float>::~optional(&local_b10);
        bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_b08);
        if (bVar2) {
          pvVar3 = nonstd::optional_lite::optional<float>::value(&local_b08);
          vd_3.contained = (storage_t<double>)(double)*pvVar3;
          TypedAttributeWithFallback<double>::operator=
                    (&metas->startTimeCode,(double *)&vd_3.contained);
LAB_001cdd21:
          v.field_2._12_4_ = 0;
        }
        else {
          crate::CrateValue::get_value<double>
                    (&local_b38,(CrateValue *)(vt.contained._24_8_ + 0x20));
          nonstd::optional_lite::optional<double>::optional<double,_0>
                    ((optional<double> *)local_b28,&local_b38);
          nonstd::optional_lite::optional<double>::~optional(&local_b38);
          bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_b28);
          if (bVar2) {
            pvVar4 = nonstd::optional_lite::optional<double>::value((optional<double> *)local_b28);
            TypedAttributeWithFallback<double>::operator=(&metas->startTimeCode,pvVar4);
            v.field_2._12_4_ = 0;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_cb0);
            poVar15 = ::std::operator<<((ostream *)local_cb0,"[error]");
            poVar15 = ::std::operator<<(poVar15,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                       );
            poVar15 = ::std::operator<<(poVar15,":");
            poVar15 = ::std::operator<<(poVar15,"ReconstrcutStageMeta");
            poVar15 = ::std::operator<<(poVar15,"():");
            poVar15 = (ostream *)::std::ostream::operator<<(poVar15,0x63e);
            ::std::operator<<(poVar15," ");
            crate::CrateValue::type_name_abi_cxx11_
                      (&local_d10,(CrateValue *)(vt.contained._24_8_ + 0x20));
            ::std::operator+((char *)&local_cf0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "`startTimeCode` value must be double or float type, but got \'");
            ::std::operator+(&local_cd0,&local_cf0,"\'");
            poVar15 = ::std::operator<<((ostream *)local_cb0,(string *)&local_cd0);
            ::std::operator<<(poVar15,"\n");
            ::std::__cxx11::string::~string((string *)&local_cd0);
            ::std::__cxx11::string::~string((string *)&local_cf0);
            ::std::__cxx11::string::~string((string *)&local_d10);
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)((long)&vs.contained + 0x10));
            ::std::__cxx11::string::~string((string *)((long)&vs.contained + 0x10));
            this_local._7_1_ = 0;
            v.field_2._12_4_ = 1;
            ::std::__cxx11::ostringstream::~ostringstream(local_cb0);
          }
          nonstd::optional_lite::optional<double>::~optional((optional<double> *)local_b28);
          if (v.field_2._12_4_ == 0) goto LAB_001cdd21;
        }
        nonstd::optional_lite::optional<float>::~optional(&local_b08);
        goto joined_r0x001cdf3a;
      }
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )vt.contained._24_8_,"subLayers");
      if (bVar2) {
        crate::CrateValue::
        get_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_d70,(CrateValue *)(vt.contained._24_8_ + 0x20));
        nonstd::optional_lite::
        optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::
        optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                  ((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_d50,&local_d70);
        nonstd::optional_lite::
        optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~optional(&local_d70);
        bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_d50);
        if (bVar2) {
          __x = nonstd::optional_lite::
                optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::value((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_d50);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&subLayerOffsets.
                          super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)__x);
          v.field_2._12_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_ee8);
          poVar15 = ::std::operator<<((ostream *)local_ee8,"[error]");
          poVar15 = ::std::operator<<(poVar15,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                     );
          poVar15 = ::std::operator<<(poVar15,":");
          poVar15 = ::std::operator<<(poVar15,"ReconstrcutStageMeta");
          poVar15 = ::std::operator<<(poVar15,"():");
          poVar15 = (ostream *)::std::ostream::operator<<(poVar15,0x648);
          ::std::operator<<(poVar15," ");
          crate::CrateValue::type_name_abi_cxx11_
                    (&local_f48,(CrateValue *)(vt.contained._24_8_ + 0x20));
          ::std::operator+((char *)&local_f28,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "`subLayers` value must be string[] type, but got \'");
          ::std::operator+(&local_f08,&local_f28,"\'");
          poVar15 = ::std::operator<<((ostream *)local_ee8,(string *)&local_f08);
          ::std::operator<<(poVar15,"\n");
          ::std::__cxx11::string::~string((string *)&local_f08);
          ::std::__cxx11::string::~string((string *)&local_f28);
          ::std::__cxx11::string::~string((string *)&local_f48);
          ::std::__cxx11::ostringstream::str();
          PushError(this,(string *)((long)&vs_1.contained + 0x10));
          ::std::__cxx11::string::~string((string *)((long)&vs_1.contained + 0x10));
          this_local._7_1_ = 0;
          v.field_2._12_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_ee8);
        }
        nonstd::optional_lite::
        optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~optional((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_d50);
        goto joined_r0x001cdf3a;
      }
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )vt.contained._24_8_,"subLayerOffsets");
      if (bVar2) {
        crate::CrateValue::
        get_value<std::vector<tinyusdz::LayerOffset,std::allocator<tinyusdz::LayerOffset>>>
                  (&local_fa8,(CrateValue *)(vt.contained._24_8_ + 0x20));
        nonstd::optional_lite::
        optional<std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>_>::
        optional<std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>,_0>
                  ((optional<std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>_>
                    *)local_f88,&local_fa8);
        nonstd::optional_lite::
        optional<std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>_>::
        ~optional(&local_fa8);
        bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_f88);
        if (bVar2) {
          __x_00 = nonstd::optional_lite::
                   optional<std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>_>
                   ::value((optional<std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>_>
                            *)local_f88);
          ::std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>::operator=
                    ((vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_> *)
                     &__range2,__x_00);
          v.field_2._12_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_1120);
          poVar15 = ::std::operator<<((ostream *)local_1120,"[error]");
          poVar15 = ::std::operator<<(poVar15,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                     );
          poVar15 = ::std::operator<<(poVar15,":");
          poVar15 = ::std::operator<<(poVar15,"ReconstrcutStageMeta");
          poVar15 = ::std::operator<<(poVar15,"():");
          poVar15 = (ostream *)::std::ostream::operator<<(poVar15,0x651);
          ::std::operator<<(poVar15," ");
          crate::CrateValue::type_name_abi_cxx11_
                    (&local_1180,(CrateValue *)(vt.contained._24_8_ + 0x20));
          ::std::operator+((char *)&local_1160,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "`subLayerOffsets` value must be LayerOffset[] type, but got \'");
          ::std::operator+(&local_1140,&local_1160,"\'");
          poVar15 = ::std::operator<<((ostream *)local_1120,(string *)&local_1140);
          ::std::operator<<(poVar15,"\n");
          ::std::__cxx11::string::~string((string *)&local_1140);
          ::std::__cxx11::string::~string((string *)&local_1160);
          ::std::__cxx11::string::~string((string *)&local_1180);
          ::std::__cxx11::ostringstream::str();
          PushError(this,(string *)&vf_4);
          ::std::__cxx11::string::~string((string *)&vf_4);
          this_local._7_1_ = 0;
          v.field_2._12_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_1120);
        }
        nonstd::optional_lite::
        optional<std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>_>::
        ~optional((optional<std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>_>
                   *)local_f88);
        goto joined_r0x001cdf3a;
      }
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )vt.contained._24_8_,"endTimeCode");
      if (bVar2) {
        crate::CrateValue::get_value<float>(&local_11b0,(CrateValue *)(vt.contained._24_8_ + 0x20));
        nonstd::optional_lite::optional<float>::optional<float,_0>(&local_11a8,&local_11b0);
        nonstd::optional_lite::optional<float>::~optional(&local_11b0);
        bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_11a8);
        if (bVar2) {
          pvVar3 = nonstd::optional_lite::optional<float>::value(&local_11a8);
          vd_4.contained = (storage_t<double>)(double)*pvVar3;
          TypedAttributeWithFallback<double>::operator=
                    (&metas->endTimeCode,(double *)&vd_4.contained);
LAB_001ce3ba:
          v.field_2._12_4_ = 0;
        }
        else {
          crate::CrateValue::get_value<double>
                    (&local_11d8,(CrateValue *)(vt.contained._24_8_ + 0x20));
          nonstd::optional_lite::optional<double>::optional<double,_0>
                    ((optional<double> *)local_11c8,&local_11d8);
          nonstd::optional_lite::optional<double>::~optional(&local_11d8);
          bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_11c8);
          if (bVar2) {
            pvVar4 = nonstd::optional_lite::optional<double>::value((optional<double> *)local_11c8);
            TypedAttributeWithFallback<double>::operator=(&metas->endTimeCode,pvVar4);
            v.field_2._12_4_ = 0;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_1350);
            poVar15 = ::std::operator<<((ostream *)local_1350,"[error]");
            poVar15 = ::std::operator<<(poVar15,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                       );
            poVar15 = ::std::operator<<(poVar15,":");
            poVar15 = ::std::operator<<(poVar15,"ReconstrcutStageMeta");
            poVar15 = ::std::operator<<(poVar15,"():");
            poVar15 = (ostream *)::std::ostream::operator<<(poVar15,0x65c);
            ::std::operator<<(poVar15," ");
            crate::CrateValue::type_name_abi_cxx11_
                      (&local_13b0,(CrateValue *)(vt.contained._24_8_ + 0x20));
            ::std::operator+((char *)&local_1390,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "`endTimeCode` value must be double or float type, but got \'");
            ::std::operator+(&local_1370,&local_1390,"\'");
            poVar15 = ::std::operator<<((ostream *)local_1350,(string *)&local_1370);
            ::std::operator<<(poVar15,"\n");
            ::std::__cxx11::string::~string((string *)&local_1370);
            ::std::__cxx11::string::~string((string *)&local_1390);
            ::std::__cxx11::string::~string((string *)&local_13b0);
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)&vf_5);
            ::std::__cxx11::string::~string((string *)&vf_5);
            this_local._7_1_ = 0;
            v.field_2._12_4_ = 1;
            ::std::__cxx11::ostringstream::~ostringstream(local_1350);
          }
          nonstd::optional_lite::optional<double>::~optional((optional<double> *)local_11c8);
          if (v.field_2._12_4_ == 0) goto LAB_001ce3ba;
        }
        nonstd::optional_lite::optional<float>::~optional(&local_11a8);
        goto joined_r0x001cdf3a;
      }
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )vt.contained._24_8_,"framesPerSecond");
      if (bVar2) {
        crate::CrateValue::get_value<float>(&local_13e0,(CrateValue *)(vt.contained._24_8_ + 0x20));
        nonstd::optional_lite::optional<float>::optional<float,_0>(&local_13d8,&local_13e0);
        nonstd::optional_lite::optional<float>::~optional(&local_13e0);
        bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_13d8);
        if (bVar2) {
          pvVar3 = nonstd::optional_lite::optional<float>::value(&local_13d8);
          vd_5.contained = (storage_t<double>)(double)*pvVar3;
          TypedAttributeWithFallback<double>::operator=
                    (&metas->framesPerSecond,(double *)&vd_5.contained);
LAB_001ce65d:
          v.field_2._12_4_ = 0;
        }
        else {
          crate::CrateValue::get_value<double>
                    (&local_1408,(CrateValue *)(vt.contained._24_8_ + 0x20));
          nonstd::optional_lite::optional<double>::optional<double,_0>
                    ((optional<double> *)local_13f8,&local_1408);
          nonstd::optional_lite::optional<double>::~optional(&local_1408);
          bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_13f8);
          if (bVar2) {
            pvVar4 = nonstd::optional_lite::optional<double>::value((optional<double> *)local_13f8);
            TypedAttributeWithFallback<double>::operator=(&metas->framesPerSecond,pvVar4);
            v.field_2._12_4_ = 0;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_1580);
            poVar15 = ::std::operator<<((ostream *)local_1580,"[error]");
            poVar15 = ::std::operator<<(poVar15,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                       );
            poVar15 = ::std::operator<<(poVar15,":");
            poVar15 = ::std::operator<<(poVar15,"ReconstrcutStageMeta");
            poVar15 = ::std::operator<<(poVar15,"():");
            poVar15 = (ostream *)::std::ostream::operator<<(poVar15,0x668);
            ::std::operator<<(poVar15," ");
            crate::CrateValue::type_name_abi_cxx11_
                      (&local_15e0,(CrateValue *)(vt.contained._24_8_ + 0x20));
            ::std::operator+((char *)&local_15c0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "`framesPerSecond` value must be double or float type, but got \'");
            ::std::operator+(&local_15a0,&local_15c0,"\'");
            poVar15 = ::std::operator<<((ostream *)local_1580,(string *)&local_15a0);
            ::std::operator<<(poVar15,"\n");
            ::std::__cxx11::string::~string((string *)&local_15a0);
            ::std::__cxx11::string::~string((string *)&local_15c0);
            ::std::__cxx11::string::~string((string *)&local_15e0);
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)local_1600);
            ::std::__cxx11::string::~string((string *)local_1600);
            this_local._7_1_ = 0;
            v.field_2._12_4_ = 1;
            ::std::__cxx11::ostringstream::~ostringstream(local_1580);
          }
          nonstd::optional_lite::optional<double>::~optional((optional<double> *)local_13f8);
          if (v.field_2._12_4_ == 0) goto LAB_001ce65d;
        }
        nonstd::optional_lite::optional<float>::~optional(&local_13d8);
        goto joined_r0x001cdf3a;
      }
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )vt.contained._24_8_,"autoPlay");
      if (bVar2) {
        crate::CrateValue::get_value<bool>((CrateValue *)((long)&vs_2.contained + 0x1c));
        nonstd::optional_lite::optional<bool>::optional<bool,_0>
                  ((optional<bool> *)((long)&vs_2.contained + 0x1e),
                   (optional<bool> *)((long)&vs_2.contained + 0x1c));
        nonstd::optional_lite::optional<bool>::~optional
                  ((optional<bool> *)((long)&vs_2.contained + 0x1c));
        bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool
                          ((optional *)((long)&vs_2.contained + 0x1e));
        if (bVar2) {
          value = nonstd::optional_lite::optional<bool>::value
                            ((optional<bool> *)((long)&vs_2.contained + 0x1e));
          TypedAttributeWithFallback<bool>::operator=(&metas->autoPlay,value);
LAB_001cea58:
          v.field_2._12_4_ = 0;
        }
        else {
          crate::CrateValue::get_value<std::__cxx11::string>
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_1658,(CrateValue *)(vt.contained._24_8_ + 0x20));
          nonstd::optional_lite::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_1630,
                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_1658);
          nonstd::optional_lite::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_1658);
          bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_1630);
          if (bVar2) {
            local_1659 = true;
            pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     nonstd::optional_lite::
                     optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_1630);
            bVar2 = ::std::operator==(pbVar5,"true");
            if (bVar2) {
              local_1659 = true;
            }
            else {
              pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       nonstd::optional_lite::
                       optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_1630);
              bVar2 = ::std::operator==(pbVar5,"false");
              if (!bVar2) {
                ::std::__cxx11::ostringstream::ostringstream(local_17d8);
                poVar15 = ::std::operator<<((ostream *)local_17d8,"[error]");
                poVar15 = ::std::operator<<(poVar15,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                           );
                poVar15 = ::std::operator<<(poVar15,":");
                poVar15 = ::std::operator<<(poVar15,"ReconstrcutStageMeta");
                poVar15 = ::std::operator<<(poVar15,"():");
                poVar15 = (ostream *)::std::ostream::operator<<(poVar15,0x677);
                ::std::operator<<(poVar15," ");
                poVar15 = ::std::operator<<((ostream *)local_17d8,
                                            "Unsupported value for `autoPlay`: ");
                psVar8 = (string *)
                         nonstd::optional_lite::
                         optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_1630);
                poVar15 = ::std::operator<<(poVar15,psVar8);
                ::std::operator<<(poVar15,"\n");
                ::std::__cxx11::ostringstream::str();
                PushError(this,&local_17f8);
                ::std::__cxx11::string::~string((string *)&local_17f8);
                this_local._7_1_ = 0;
                v.field_2._12_4_ = 1;
                ::std::__cxx11::ostringstream::~ostringstream(local_17d8);
                goto LAB_001cea3e;
              }
              local_1659 = false;
            }
            TypedAttributeWithFallback<bool>::operator=(&metas->autoPlay,&local_1659);
            v.field_2._12_4_ = 0;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_1970);
            poVar15 = ::std::operator<<((ostream *)local_1970,"[error]");
            poVar15 = ::std::operator<<(poVar15,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                       );
            poVar15 = ::std::operator<<(poVar15,":");
            poVar15 = ::std::operator<<(poVar15,"ReconstrcutStageMeta");
            poVar15 = ::std::operator<<(poVar15,"():");
            poVar15 = (ostream *)::std::ostream::operator<<(poVar15,0x67e);
            ::std::operator<<(poVar15," ");
            crate::CrateValue::type_name_abi_cxx11_
                      (&local_19d0,(CrateValue *)(vt.contained._24_8_ + 0x20));
            ::std::operator+((char *)&local_19b0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "`autoPlay` value must be bool type or string type, but got \'");
            ::std::operator+(&local_1990,&local_19b0,"\'");
            poVar15 = ::std::operator<<((ostream *)local_1970,(string *)&local_1990);
            ::std::operator<<(poVar15,"\n");
            ::std::__cxx11::string::~string((string *)&local_1990);
            ::std::__cxx11::string::~string((string *)&local_19b0);
            ::std::__cxx11::string::~string((string *)&local_19d0);
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)((long)&vf_7.contained + 0x18));
            ::std::__cxx11::string::~string((string *)((long)&vf_7.contained + 0x18));
            this_local._7_1_ = 0;
            v.field_2._12_4_ = 1;
            ::std::__cxx11::ostringstream::~ostringstream(local_1970);
          }
LAB_001cea3e:
          nonstd::optional_lite::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_1630);
          if (v.field_2._12_4_ == 0) goto LAB_001cea58;
        }
        nonstd::optional_lite::optional<bool>::~optional
                  ((optional<bool> *)((long)&vs_2.contained + 0x1e));
        goto joined_r0x001cdf3a;
      }
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )vt.contained._24_8_,"playbackMode");
      if (bVar2) {
        crate::CrateValue::get_value<tinyusdz::Token>
                  (&local_1a40,(CrateValue *)(vt.contained._24_8_ + 0x20));
        nonstd::optional_lite::optional<tinyusdz::Token>::optional<tinyusdz::Token,_0>
                  ((optional<tinyusdz::Token> *)local_1a18,&local_1a40);
        nonstd::optional_lite::optional<tinyusdz::Token>::~optional(&local_1a40);
        bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_1a18);
        if (bVar2) {
          pvVar6 = nonstd::optional_lite::optional<tinyusdz::Token>::value
                             ((optional<tinyusdz::Token> *)local_1a18);
          psVar11 = Token::str_abi_cxx11_(pvVar6);
          bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)psVar11,"none");
          if (bVar2) {
            local_1a44 = PlaybackModeNone;
            TypedAttributeWithFallback<tinyusdz::LayerMetas::PlaybackMode>::operator=
                      (&metas->playbackMode,&local_1a44);
          }
          else {
            pvVar6 = nonstd::optional_lite::optional<tinyusdz::Token>::value
                               ((optional<tinyusdz::Token> *)local_1a18);
            psVar11 = Token::str_abi_cxx11_(pvVar6);
            bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)psVar11,"loop");
            if (!bVar2) {
              ::std::__cxx11::ostringstream::ostringstream(local_1bc0);
              poVar15 = ::std::operator<<((ostream *)local_1bc0,"[error]");
              poVar15 = ::std::operator<<(poVar15,
                                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                         );
              poVar15 = ::std::operator<<(poVar15,":");
              poVar15 = ::std::operator<<(poVar15,"ReconstrcutStageMeta");
              poVar15 = ::std::operator<<(poVar15,"():");
              poVar15 = (ostream *)::std::ostream::operator<<(poVar15,0x688);
              ::std::operator<<(poVar15," ");
              poVar15 = ::std::operator<<((ostream *)local_1bc0,
                                          "Unsupported token value for `playbackMode`.");
              ::std::operator<<(poVar15,"\n");
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)((long)&vs_3.contained + 0x18));
              ::std::__cxx11::string::~string((string *)((long)&vs_3.contained + 0x18));
              this_local._7_1_ = 0;
              v.field_2._12_4_ = 1;
              ::std::__cxx11::ostringstream::~ostringstream(local_1bc0);
              goto LAB_001cefe3;
            }
            local_1a48 = PlaybackModeLoop;
            TypedAttributeWithFallback<tinyusdz::LayerMetas::PlaybackMode>::operator=
                      (&metas->playbackMode,&local_1a48);
          }
LAB_001cefd9:
          v.field_2._12_4_ = 0;
        }
        else {
          crate::CrateValue::get_value<std::__cxx11::string>
                    (&local_1c30,(CrateValue *)(vt.contained._24_8_ + 0x20));
          nonstd::optional_lite::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_1c08,&local_1c30);
          nonstd::optional_lite::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~optional(&local_1c30);
          bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_1c08);
          if (bVar2) {
            pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     nonstd::optional_lite::
                     optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_1c08);
            bVar2 = ::std::operator==(pbVar5,"none");
            if (bVar2) {
              local_1c34 = PlaybackModeNone;
              TypedAttributeWithFallback<tinyusdz::LayerMetas::PlaybackMode>::operator=
                        (&metas->playbackMode,&local_1c34);
            }
            else {
              pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       nonstd::optional_lite::
                       optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_1c08);
              bVar2 = ::std::operator==(pbVar5,"loop");
              if (!bVar2) {
                ::std::__cxx11::ostringstream::ostringstream(local_1db0);
                poVar15 = ::std::operator<<((ostream *)local_1db0,"[error]");
                poVar15 = ::std::operator<<(poVar15,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                           );
                poVar15 = ::std::operator<<(poVar15,":");
                poVar15 = ::std::operator<<(poVar15,"ReconstrcutStageMeta");
                poVar15 = ::std::operator<<(poVar15,"():");
                poVar15 = (ostream *)::std::ostream::operator<<(poVar15,0x692);
                ::std::operator<<(poVar15," ");
                poVar15 = ::std::operator<<((ostream *)local_1db0,
                                            "Unsupported value for `playbackMode`: ");
                psVar8 = (string *)
                         nonstd::optional_lite::
                         optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_1c08);
                poVar15 = ::std::operator<<(poVar15,psVar8);
                ::std::operator<<(poVar15,"\n");
                ::std::__cxx11::ostringstream::str();
                PushError(this,&local_1dd0);
                ::std::__cxx11::string::~string((string *)&local_1dd0);
                this_local._7_1_ = 0;
                v.field_2._12_4_ = 1;
                ::std::__cxx11::ostringstream::~ostringstream(local_1db0);
                goto LAB_001cefbf;
              }
              local_1c38 = PlaybackModeLoop;
              TypedAttributeWithFallback<tinyusdz::LayerMetas::PlaybackMode>::operator=
                        (&metas->playbackMode,&local_1c38);
            }
            v.field_2._12_4_ = 0;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_1f48);
            poVar15 = ::std::operator<<((ostream *)local_1f48,"[error]");
            poVar15 = ::std::operator<<(poVar15,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                       );
            poVar15 = ::std::operator<<(poVar15,":");
            poVar15 = ::std::operator<<(poVar15,"ReconstrcutStageMeta");
            poVar15 = ::std::operator<<(poVar15,"():");
            poVar15 = (ostream *)::std::ostream::operator<<(poVar15,0x698);
            ::std::operator<<(poVar15," ");
            crate::CrateValue::type_name_abi_cxx11_
                      (&local_1fa8,(CrateValue *)(vt.contained._24_8_ + 0x20));
            ::std::operator+((char *)&local_1f88,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "`playbackMode` value must be token type, but got \'");
            ::std::operator+(&local_1f68,&local_1f88,"\'");
            poVar15 = ::std::operator<<((ostream *)local_1f48,(string *)&local_1f68);
            ::std::operator<<(poVar15,"\n");
            ::std::__cxx11::string::~string((string *)&local_1f68);
            ::std::__cxx11::string::~string((string *)&local_1f88);
            ::std::__cxx11::string::~string((string *)&local_1fa8);
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)((long)&v_1.contained + 0x18));
            ::std::__cxx11::string::~string((string *)((long)&v_1.contained + 0x18));
            this_local._7_1_ = 0;
            v.field_2._12_4_ = 1;
            ::std::__cxx11::ostringstream::~ostringstream(local_1f48);
          }
LAB_001cefbf:
          nonstd::optional_lite::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_1c08);
          if (v.field_2._12_4_ == 0) goto LAB_001cefd9;
        }
LAB_001cefe3:
        nonstd::optional_lite::optional<tinyusdz::Token>::~optional
                  ((optional<tinyusdz::Token> *)local_1a18);
        goto joined_r0x001cdf3a;
      }
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )vt.contained._24_8_,"defaultPrim");
      if (bVar2) {
        crate::CrateValue::get_value<tinyusdz::Token>
                  (&local_2018,(CrateValue *)(vt.contained._24_8_ + 0x20));
        nonstd::optional_lite::optional<tinyusdz::Token>::optional<tinyusdz::Token,_0>
                  ((optional<tinyusdz::Token> *)local_1ff0,&local_2018);
        nonstd::optional_lite::optional<tinyusdz::Token>::~optional(&local_2018);
        bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_1ff0);
        if (bVar2) {
          pvVar6 = nonstd::optional_lite::optional<tinyusdz::Token>::value
                             ((optional<tinyusdz::Token> *)local_1ff0);
          Token::operator=(&metas->defaultPrim,pvVar6);
          v.field_2._12_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_2190);
          poVar15 = ::std::operator<<((ostream *)local_2190,"[error]");
          poVar15 = ::std::operator<<(poVar15,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                     );
          poVar15 = ::std::operator<<(poVar15,":");
          poVar15 = ::std::operator<<(poVar15,"ReconstrcutStageMeta");
          poVar15 = ::std::operator<<(poVar15,"():");
          poVar15 = (ostream *)::std::ostream::operator<<(poVar15,0x69d);
          ::std::operator<<(poVar15," ");
          poVar15 = ::std::operator<<((ostream *)local_2190,"`defaultPrim` must be `token` type.");
          ::std::operator<<(poVar15,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,(string *)((long)&v_2.contained + 0x28));
          ::std::__cxx11::string::~string((string *)((long)&v_2.contained + 0x28));
          this_local._7_1_ = 0;
          v.field_2._12_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_2190);
        }
        nonstd::optional_lite::optional<tinyusdz::Token>::~optional
                  ((optional<tinyusdz::Token> *)local_1ff0);
        goto joined_r0x001cdf3a;
      }
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )vt.contained._24_8_,"customLayerData");
      if (bVar2) {
        crate::CrateValue::
        get_value<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                  (&local_2220,(CrateValue *)(vt.contained._24_8_ + 0x20));
        nonstd::optional_lite::
        optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
        ::
        optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>,_0>
                  ((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                    *)local_21e8,&local_2220);
        nonstd::optional_lite::
        optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
        ::~optional(&local_2220);
        bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_21e8);
        if (bVar2) {
          pvVar7 = nonstd::optional_lite::
                   optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                   ::value((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                            *)local_21e8);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
          ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                       *)&metas->customLayerData,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                       *)pvVar7);
          v.field_2._12_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_2398);
          poVar15 = ::std::operator<<((ostream *)local_2398,"[error]");
          poVar15 = ::std::operator<<(poVar15,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                     );
          poVar15 = ::std::operator<<(poVar15,":");
          poVar15 = ::std::operator<<(poVar15,"ReconstrcutStageMeta");
          poVar15 = ::std::operator<<(poVar15,"():");
          poVar15 = (ostream *)::std::ostream::operator<<(poVar15,0x6a8);
          ::std::operator<<(poVar15," ");
          crate::CrateValue::type_name_abi_cxx11_
                    (&local_23d8,(CrateValue *)(vt.contained._24_8_ + 0x20));
          ::std::operator+((char *)local_23b8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "customLayerData must be `dictionary` type, but got type `");
          poVar15 = ::std::operator<<((ostream *)local_2398,local_23b8);
          ::std::operator<<(poVar15,"\n");
          ::std::__cxx11::string::~string(local_23b8);
          ::std::__cxx11::string::~string((string *)&local_23d8);
          ::std::__cxx11::ostringstream::str();
          PushError(this,(string *)((long)&v_3.contained + 0x10));
          ::std::__cxx11::string::~string((string *)((long)&v_3.contained + 0x10));
          this_local._7_1_ = 0;
          v.field_2._12_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_2398);
        }
        nonstd::optional_lite::
        optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
        ::~optional((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                     *)local_21e8);
        goto joined_r0x001cdf3a;
      }
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )vt.contained._24_8_,"primChildren");
      if (bVar2) {
        crate::CrateValue::get_value<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                  (&local_2438,(CrateValue *)(vt.contained._24_8_ + 0x20));
        nonstd::optional_lite::
        optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::
        optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>,_0>
                  ((optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
                   local_2418,&local_2438);
        nonstd::optional_lite::
        optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::~optional
                  (&local_2438);
        bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_2418);
        if (bVar2) {
          __x_01 = nonstd::optional_lite::
                   optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::value
                             ((optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                               *)local_2418);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &metas->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)__x_01);
          v.field_2._12_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_25b0);
          poVar15 = ::std::operator<<((ostream *)local_25b0,"[error]");
          poVar15 = ::std::operator<<(poVar15,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                     );
          poVar15 = ::std::operator<<(poVar15,":");
          poVar15 = ::std::operator<<(poVar15,"ReconstrcutStageMeta");
          poVar15 = ::std::operator<<(poVar15,"():");
          poVar15 = (ostream *)::std::ostream::operator<<(poVar15,0x6ae);
          ::std::operator<<(poVar15," ");
          crate::CrateValue::type_name_abi_cxx11_
                    (&local_25f0,(CrateValue *)(vt.contained._24_8_ + 0x20));
          ::std::operator+((char *)local_25d0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "Type must be `token[]` for `primChildren`, but got ");
          poVar15 = ::std::operator<<((ostream *)local_25b0,local_25d0);
          ::std::operator<<(poVar15,"\n");
          ::std::__cxx11::string::~string(local_25d0);
          ::std::__cxx11::string::~string((string *)&local_25f0);
          ::std::__cxx11::ostringstream::str();
          PushError(this,(string *)((long)&v_4.contained + 0x18));
          ::std::__cxx11::string::~string((string *)((long)&v_4.contained + 0x18));
          this_local._7_1_ = 0;
          v.field_2._12_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_25b0);
        }
        nonstd::optional_lite::
        optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::~optional
                  ((optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
                   local_2418);
        goto joined_r0x001cdf3a;
      }
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )vt.contained._24_8_,"documentation");
      if (bVar2) {
        crate::CrateValue::get_value<std::__cxx11::string>
                  (&local_2660,(CrateValue *)(vt.contained._24_8_ + 0x20));
        nonstd::optional_lite::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_2638,&local_2660);
        nonstd::optional_lite::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~optional(&local_2660);
        bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_2638);
        if (bVar2) {
          tinyusdz::value::StringData::StringData((StringData *)((long)&v_5.contained + 0x18));
          psVar8 = (string *)
                   nonstd::optional_lite::
                   optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_2638);
          ::std::__cxx11::string::operator=((string *)((long)&v_5.contained + 0x18),psVar8);
          sdata.value.field_2._M_local_buf[8] = hasNewline((string *)((long)&v_5.contained + 0x18));
          tinyusdz::value::StringData::operator=
                    (&metas->doc,(StringData *)((long)&v_5.contained + 0x18));
          tinyusdz::value::StringData::~StringData((StringData *)((long)&v_5.contained + 0x18));
          v.field_2._12_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_27d8);
          poVar15 = ::std::operator<<((ostream *)local_27d8,"[error]");
          poVar15 = ::std::operator<<(poVar15,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                     );
          poVar15 = ::std::operator<<(poVar15,":");
          poVar15 = ::std::operator<<(poVar15,"ReconstrcutStageMeta");
          poVar15 = ::std::operator<<(poVar15,"():");
          poVar15 = (ostream *)::std::ostream::operator<<(poVar15,0x6b6);
          ::std::operator<<(poVar15," ");
          crate::CrateValue::type_name_abi_cxx11_
                    (&local_2818,(CrateValue *)(vt.contained._24_8_ + 0x20));
          ::std::operator+((char *)local_27f8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "Type must be `string` for `documentation`, but got ");
          poVar15 = ::std::operator<<((ostream *)local_27d8,local_27f8);
          ::std::operator<<(poVar15,"\n");
          ::std::__cxx11::string::~string(local_27f8);
          ::std::__cxx11::string::~string((string *)&local_2818);
          ::std::__cxx11::ostringstream::str();
          PushError(this,(string *)&sdata.line_col);
          ::std::__cxx11::string::~string((string *)&sdata.line_col);
          this_local._7_1_ = 0;
          v.field_2._12_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_27d8);
        }
        nonstd::optional_lite::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_2638);
        goto joined_r0x001cdf3a;
      }
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )vt.contained._24_8_,"comment");
      if (bVar2) {
        crate::CrateValue::get_value<std::__cxx11::string>
                  (&local_28b8,(CrateValue *)(vt.contained._24_8_ + 0x20));
        nonstd::optional_lite::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_2890,&local_28b8);
        nonstd::optional_lite::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~optional(&local_28b8);
        bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_2890);
        if (bVar2) {
          tinyusdz::value::StringData::StringData((StringData *)local_2ac0);
          psVar8 = (string *)
                   nonstd::optional_lite::
                   optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_2890);
          ::std::__cxx11::string::operator=((string *)local_2ac0,psVar8);
          sdata_1.value.field_2._M_local_buf[8] = hasNewline((string *)local_2ac0);
          tinyusdz::value::StringData::operator=(&metas->comment,(StringData *)local_2ac0);
          tinyusdz::value::StringData::~StringData((StringData *)local_2ac0);
          v.field_2._12_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_2a30);
          poVar15 = ::std::operator<<((ostream *)local_2a30,"[error]");
          poVar15 = ::std::operator<<(poVar15,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                     );
          poVar15 = ::std::operator<<(poVar15,":");
          poVar15 = ::std::operator<<(poVar15,"ReconstrcutStageMeta");
          poVar15 = ::std::operator<<(poVar15,"():");
          poVar15 = (ostream *)::std::ostream::operator<<(poVar15,0x6c1);
          ::std::operator<<(poVar15," ");
          crate::CrateValue::type_name_abi_cxx11_
                    (&local_2a70,(CrateValue *)(vt.contained._24_8_ + 0x20));
          ::std::operator+((char *)local_2a50,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "Type must be `string` for `comment`, but got ");
          poVar15 = ::std::operator<<((ostream *)local_2a30,local_2a50);
          ::std::operator<<(poVar15,"\n");
          ::std::__cxx11::string::~string(local_2a50);
          ::std::__cxx11::string::~string((string *)&local_2a70);
          ::std::__cxx11::ostringstream::str();
          PushError(this,(string *)&sdata_1.line_col);
          ::std::__cxx11::string::~string((string *)&sdata_1.line_col);
          this_local._7_1_ = 0;
          v.field_2._12_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_2a30);
        }
        nonstd::optional_lite::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_2890);
        goto joined_r0x001cdf3a;
      }
      ::std::__cxx11::ostringstream::ostringstream(local_2c38);
      poVar15 = ::std::operator<<((ostream *)local_2c38,"[warn]");
      poVar15 = ::std::operator<<(poVar15,
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                 );
      poVar15 = ::std::operator<<(poVar15,":");
      poVar15 = ::std::operator<<(poVar15,"ReconstrcutStageMeta");
      poVar15 = ::std::operator<<(poVar15,"():");
      poVar15 = (ostream *)::std::ostream::operator<<(poVar15,0x6c9);
      ::std::operator<<(poVar15," ");
      ::std::operator+(&local_2c58,"[StageMeta] TODO: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       vt.contained._24_8_);
      poVar15 = ::std::operator<<((ostream *)local_2c38,(string *)&local_2c58);
      ::std::operator<<(poVar15,"\n");
      ::std::__cxx11::string::~string((string *)&local_2c58);
      ::std::__cxx11::ostringstream::str();
      PushWarn(this,(string *)
                    &dst.super__Vector_base<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &dst.super__Vector_base<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::ostringstream::~ostringstream(local_2c38);
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>
    ::operator++(&__end2);
  }
  sVar9 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&subLayerOffsets.
                     super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (sVar9 == 0) {
    sVar9 = ::std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>::size
                      ((vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_> *)
                       &__range2);
    if (sVar9 != 0) {
      ::std::__cxx11::ostringstream::ostringstream(local_2ea8);
      poVar15 = ::std::operator<<((ostream *)local_2ea8,"[warn]");
      poVar15 = ::std::operator<<(poVar15,
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                 );
      poVar15 = ::std::operator<<(poVar15,":");
      poVar15 = ::std::operator<<(poVar15,"ReconstrcutStageMeta");
      poVar15 = ::std::operator<<(poVar15,"():");
      poVar15 = (ostream *)::std::ostream::operator<<(poVar15,0x6de);
      ::std::operator<<(poVar15," ");
      poVar15 = ::std::operator<<((ostream *)local_2ea8,
                                  "Corrupted subLayer info? `subLayers` Fileld not found.");
      ::std::operator<<(poVar15,"\n");
      ::std::__cxx11::ostringstream::str();
      PushWarn(this,&local_2ec8);
      ::std::__cxx11::string::~string((string *)&local_2ec8);
      ::std::__cxx11::ostringstream::~ostringstream(local_2ea8);
    }
  }
  else {
    ::std::vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>::vector
              ((vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_> *)&i);
    for (s.layerOffset._scale = 0.0; dVar1 = s.layerOffset._scale,
        dVar10 = (double)std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&subLayerOffsets.
                                    super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage),
        (ulong)dVar1 < (ulong)dVar10;
        s.layerOffset._scale = (double)((long)s.layerOffset._scale + 1)) {
      SubLayer::SubLayer((SubLayer *)local_2ce8);
      psVar11 = (string *)
                ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&subLayerOffsets.
                                 super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (size_type)s.layerOffset._scale);
      tinyusdz::value::AssetPath::AssetPath((AssetPath *)&i_1,psVar11);
      tinyusdz::value::AssetPath::operator=((AssetPath *)local_2ce8,(AssetPath *)&i_1);
      tinyusdz::value::AssetPath::~AssetPath((AssetPath *)&i_1);
      ::std::vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>::push_back
                ((vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_> *)&i,
                 (value_type *)local_2ce8);
      SubLayer::~SubLayer((SubLayer *)local_2ce8);
    }
    sVar9 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&subLayerOffsets.
                       super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar12 = ::std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>::size
                       ((vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_> *)
                        &__range2);
    if (sVar9 == sVar12) {
      for (local_2d30 = 0;
          sVar9 = ::std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>::size
                            ((vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>
                              *)&__range2), local_2d30 < sVar9; local_2d30 = local_2d30 + 1) {
        pvVar13 = ::std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>::
                  operator[]((vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>
                              *)&__range2,local_2d30);
        pvVar14 = ::std::vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>::operator[]
                            ((vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_> *)&i,
                             local_2d30);
        (pvVar14->layerOffset)._offset = pvVar13->_offset;
        (pvVar14->layerOffset)._scale = pvVar13->_scale;
      }
    }
    std::vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>::operator=
              ((vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_> *)&metas->subLayers,
               (vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_> *)&i);
    ::std::vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>::~vector
              ((vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_> *)&i);
  }
  this_local._7_1_ = 1;
  v.field_2._12_4_ = 1;
LAB_001cfd59:
  ::std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>::~vector
            ((vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_> *)&__range2);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&subLayerOffsets.
                super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool USDCReader::Impl::ReconstrcutStageMeta(
    const crate::FieldValuePairVector &fvs, StageMetas *metas) {
  /// Stage(toplevel layer) Meta fieldSet example.
  ///
  ///   specTy = SpecTypePseudoRoot
  ///
  ///     - subLayers(+ subLayerOffsets)
  ///     - customLayerData(dict)
  ///     - defaultPrim(token)
  ///     - metersPerUnit(double)
  ///     - kilogramsPerUnit(double)
  ///     - timeCodesPerSecond(double)
  ///     - upAxis(token)
  ///     - documentation(string) : `doc`
  ///     - comment(string) : comment
  ///     - primChildren(token[]) : Crate only. List of root prims(Root Prim should be traversed based on this array)

  std::vector<std::string> subLayers;
  std::vector<LayerOffset> subLayerOffsets;

  for (const auto &fv : fvs) {
    if (fv.first == "upAxis") {
      auto vt = fv.second.get_value<value::token>();
      if (!vt) {
        PUSH_ERROR_AND_RETURN("`upAxis` must be `token` type.");
      }

      std::string v = vt.value().str();
      if (v == "Y") {
        metas->upAxis = Axis::Y;
      } else if (v == "Z") {
        metas->upAxis = Axis::Z;
      } else if (v == "X") {
        metas->upAxis = Axis::X;
      } else {
        PUSH_ERROR_AND_RETURN("`upAxis` must be 'X', 'Y' or 'Z' but got '" + v +
                              "'(note: Case sensitive)");
      }
      DCOUT("upAxis = " << to_string(metas->upAxis.get_value()));

    } else if (fv.first == "metersPerUnit") {
      if (auto vf = fv.second.get_value<float>()) {
        metas->metersPerUnit = double(vf.value());
      } else if (auto vd = fv.second.get_value<double>()) {
        metas->metersPerUnit = vd.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "`metersPerUnit` value must be double or float type, but got '" +
            fv.second.type_name() + "'");
      }
      DCOUT("metersPerUnit = " << metas->metersPerUnit.get_value());
    } else if (fv.first == "kilogramsPerUnit") {
      if (auto vf = fv.second.get_value<float>()) {
        metas->kilogramsPerUnit = double(vf.value());
      } else if (auto vd = fv.second.get_value<double>()) {
        metas->kilogramsPerUnit = vd.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "`kilogramsPerUnit` value must be double or float type, but got '" +
            fv.second.type_name() + "'");
      }
      DCOUT("kilogramsPerUnit = " << metas->kilogramsPerUnit.get_value());
    } else if (fv.first == "timeCodesPerSecond") {
      if (auto vf = fv.second.get_value<float>()) {
        metas->timeCodesPerSecond = double(vf.value());
      } else if (auto vd = fv.second.get_value<double>()) {
        metas->timeCodesPerSecond = vd.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "`timeCodesPerSecond` value must be double or float "
            "type, but got '" +
            fv.second.type_name() + "'");
      }
      DCOUT("timeCodesPerSecond = " << metas->timeCodesPerSecond.get_value());
    } else if (fv.first == "startTimeCode") {
      if (auto vf = fv.second.get_value<float>()) {
        metas->startTimeCode = double(vf.value());
      } else if (auto vd = fv.second.get_value<double>()) {
        metas->startTimeCode = vd.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "`startTimeCode` value must be double or float "
            "type, but got '" +
            fv.second.type_name() + "'");
      }
      DCOUT("startimeCode = " << metas->startTimeCode.get_value());
    } else if (fv.first == "subLayers") {
      if (auto vs = fv.second.get_value<std::vector<std::string>>()) {
        subLayers = vs.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "`subLayers` value must be string[] "
            "type, but got '" +
            fv.second.type_name() + "'");
      }
    } else if (fv.first == "subLayerOffsets") {
      if (auto vs = fv.second.get_value<std::vector<LayerOffset>>()) {
        subLayerOffsets = vs.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "`subLayerOffsets` value must be LayerOffset[] "
            "type, but got '" +
            fv.second.type_name() + "'");
      }
    } else if (fv.first == "endTimeCode") {
      if (auto vf = fv.second.get_value<float>()) {
        metas->endTimeCode = double(vf.value());
      } else if (auto vd = fv.second.get_value<double>()) {
        metas->endTimeCode = vd.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "`endTimeCode` value must be double or float "
            "type, but got '" +
            fv.second.type_name() + "'");
      }
      DCOUT("endTimeCode = " << metas->endTimeCode.get_value());
    } else if (fv.first == "framesPerSecond") {
      if (auto vf = fv.second.get_value<float>()) {
        metas->framesPerSecond = double(vf.value());
      } else if (auto vd = fv.second.get_value<double>()) {
        metas->framesPerSecond = vd.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "`framesPerSecond` value must be double or float "
            "type, but got '" +
            fv.second.type_name() + "'");
      }
      DCOUT("framesPerSecond = " << metas->framesPerSecond.get_value());
    } else if (fv.first == "autoPlay") {
      if (auto vf = fv.second.get_value<bool>()) {
        metas->autoPlay = vf.value();
      } else if (auto vs = fv.second.get_value<std::string>()) {
        // unregisteredvalue uses string type.
        bool autoPlay{true};
        if (vs.value() == "true") {
          autoPlay = true;
        } else if (vs.value() == "false") {
          autoPlay = false;
        } else {
          PUSH_ERROR_AND_RETURN(
              "Unsupported value for `autoPlay`: " << vs.value());
        }
        metas->autoPlay = autoPlay;
      } else {
        PUSH_ERROR_AND_RETURN(
            "`autoPlay` value must be bool "
            "type or string type, but got '" +
            fv.second.type_name() + "'");
      }
      DCOUT("autoPlay = " << metas->autoPlay.get_value());
    } else if (fv.first == "playbackMode") {
      if (auto vf = fv.second.get_value<value::token>()) {
        if (vf.value().str() == "none") {
          metas->playbackMode = StageMetas::PlaybackMode::PlaybackModeNone;
        } else if (vf.value().str() == "loop") {
          metas->playbackMode = StageMetas::PlaybackMode::PlaybackModeLoop;
        } else {
          PUSH_ERROR_AND_RETURN("Unsupported token value for `playbackMode`.");
        }
      } else if (auto vs = fv.second.get_value<std::string>()) {
        // unregisteredvalue uses string type.
        if (vs.value() == "none") {
          metas->playbackMode = StageMetas::PlaybackMode::PlaybackModeNone;
        } else if (vs.value() == "loop") {
          metas->playbackMode = StageMetas::PlaybackMode::PlaybackModeLoop;
        } else {
          PUSH_ERROR_AND_RETURN(
              "Unsupported value for `playbackMode`: " << vs.value());
        }
      } else {
        PUSH_ERROR_AND_RETURN(
            "`playbackMode` value must be token "
            "type, but got '" +
            fv.second.type_name() + "'");
      }
    } else if ((fv.first == "defaultPrim")) {
      auto v = fv.second.get_value<value::token>();
      if (!v) {
        PUSH_ERROR_AND_RETURN("`defaultPrim` must be `token` type.");
      }

      metas->defaultPrim = v.value();
      DCOUT("defaultPrim = " << metas->defaultPrim.str());
    } else if (fv.first == "customLayerData") {
      if (auto v = fv.second.get_value<CustomDataType>()) {
        metas->customLayerData = v.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "customLayerData must be `dictionary` type, but got type `" +
            fv.second.type_name());
      }
    } else if (fv.first == "primChildren") {  // only appears in USDC.
      auto v = fv.second.get_value<std::vector<value::token>>();
      if (!v) {
        PUSH_ERROR_AND_RETURN("Type must be `token[]` for `primChildren`, but got " +
                   fv.second.type_name());
      }

      metas->primChildren = v.value();
    } else if (fv.first == "documentation") {  // 'doc'
      auto v = fv.second.get_value<std::string>();
      if (!v) {
        PUSH_ERROR_AND_RETURN("Type must be `string` for `documentation`, but got " +
                   fv.second.type_name());
      }
      value::StringData sdata;
      sdata.value = v.value();
      sdata.is_triple_quoted = hasNewline(sdata.value);
      metas->doc = sdata;
      DCOUT("doc = " << metas->doc.value);
    } else if (fv.first == "comment") {  // 'comment'
      auto v = fv.second.get_value<std::string>();
      if (!v) {
        PUSH_ERROR_AND_RETURN("Type must be `string` for `comment`, but got " +
                   fv.second.type_name());
      }
      value::StringData sdata;
      sdata.value = v.value();
      sdata.is_triple_quoted = hasNewline(sdata.value);
      metas->comment = sdata;
      DCOUT("comment = " << metas->comment.value);
    } else {
      PUSH_WARN("[StageMeta] TODO: " + fv.first);
    }
  }

  if (subLayers.size()) {
    std::vector<SubLayer> dst;
    for (size_t i = 0; i < subLayers.size(); i++) {
      SubLayer s;
      s.assetPath = subLayers[i];
      dst.push_back(s);
    }

    if (subLayers.size() == subLayerOffsets.size()) {
      for (size_t i = 0; i < subLayerOffsets.size(); i++) {
        dst[i].layerOffset = subLayerOffsets[i];
      }
    }

    metas->subLayers = dst;

  } else if (subLayerOffsets.size()) {
    PUSH_WARN("Corrupted subLayer info? `subLayers` Fileld not found.");
  }

  return true;
}